

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlAttrPtr xmlNewPropInternal(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value,int eatname)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlNodePtr pxVar3;
  xmlRegisterNodeFunc *pp_Var4;
  _xmlNode *local_58;
  xmlAttrPtr prev;
  xmlNodePtr tmp;
  xmlDocPtr doc;
  xmlAttrPtr cur;
  int eatname_local;
  xmlChar *value_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  
  tmp = (xmlNodePtr)0x0;
  if ((node == (xmlNodePtr)0x0) || (node->type == XML_ELEMENT_NODE)) {
    node_local = (xmlNodePtr)(*xmlMalloc)(0x60);
    if (node_local == (xmlNodePtr)0x0) {
      if ((eatname == 1) &&
         (((node == (xmlNodePtr)0x0 || (node->doc == (_xmlDoc *)0x0)) ||
          ((node->doc->dict == (_xmlDict *)0x0 ||
           (iVar1 = xmlDictOwns(node->doc->dict,name), iVar1 == 0)))))) {
        (*xmlFree)(name);
      }
      xmlTreeErrMemory("building attribute");
      node_local = (xmlNodePtr)0x0;
    }
    else {
      memset(node_local,0,0x60);
      node_local->type = XML_ATTRIBUTE_NODE;
      node_local->parent = node;
      if (node != (xmlNodePtr)0x0) {
        tmp = (xmlNodePtr)node->doc;
        node_local->doc = (_xmlDoc *)tmp;
      }
      node_local->ns = ns;
      if (eatname == 0) {
        if ((tmp == (xmlNodePtr)0x0) || (tmp[1].last == (_xmlNode *)0x0)) {
          pxVar2 = xmlStrdup(name);
          node_local->name = pxVar2;
        }
        else {
          pxVar2 = xmlDictLookup((xmlDictPtr)tmp[1].last,name,-1);
          node_local->name = pxVar2;
        }
      }
      else {
        node_local->name = name;
      }
      if (value != (xmlChar *)0x0) {
        pxVar3 = xmlNewDocText((xmlDoc *)tmp,value);
        node_local->children = pxVar3;
        node_local->last = (_xmlNode *)0x0;
        for (prev = (xmlAttrPtr)node_local->children; prev != (xmlAttrPtr)0x0; prev = prev->next) {
          prev->parent = node_local;
          if (prev->next == (_xmlAttr *)0x0) {
            node_local->last = (_xmlNode *)prev;
          }
        }
      }
      if (node != (xmlNodePtr)0x0) {
        if (node->properties == (_xmlAttr *)0x0) {
          node->properties = (_xmlAttr *)node_local;
        }
        else {
          for (local_58 = (_xmlNode *)node->properties; local_58->next != (_xmlNode *)0x0;
              local_58 = local_58->next) {
          }
          local_58->next = node_local;
          node_local->prev = local_58;
        }
      }
      if (((value != (xmlChar *)0x0) && (node != (xmlNodePtr)0x0)) &&
         (iVar1 = xmlIsID(node->doc,node,(xmlAttrPtr)node_local), iVar1 == 1)) {
        xmlAddID((xmlValidCtxtPtr)0x0,node->doc,value,(xmlAttrPtr)node_local);
      }
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var4 = __xmlRegisterNodeDefaultValue(), *pp_Var4 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var4 = __xmlRegisterNodeDefaultValue();
        (**pp_Var4)(node_local);
      }
    }
  }
  else {
    if ((eatname == 1) &&
       (((node->doc == (_xmlDoc *)0x0 || (node->doc->dict == (_xmlDict *)0x0)) ||
        (iVar1 = xmlDictOwns(node->doc->dict,name), iVar1 == 0)))) {
      (*xmlFree)(name);
    }
    node_local = (xmlNodePtr)0x0;
  }
  return (xmlAttrPtr)node_local;
}

Assistant:

static xmlAttrPtr
xmlNewPropInternal(xmlNodePtr node, xmlNsPtr ns,
                   const xmlChar * name, const xmlChar * value,
                   int eatname)
{
    xmlAttrPtr cur;
    xmlDocPtr doc = NULL;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE)) {
        if ((eatname == 1) &&
	    ((node->doc == NULL) || (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        return (NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL) {
        if ((eatname == 1) &&
	    ((node == NULL) || (node->doc == NULL) ||
             (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        xmlTreeErrMemory("building attribute");
        return (NULL);
    }
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    cur->parent = node;
    if (node != NULL) {
        doc = node->doc;
        cur->doc = doc;
    }
    cur->ns = ns;

    if (eatname == 0) {
        if ((doc != NULL) && (doc->dict != NULL))
            cur->name = (xmlChar *) xmlDictLookup(doc->dict, name, -1);
        else
            cur->name = xmlStrdup(name);
    } else
        cur->name = name;

    if (value != NULL) {
        xmlNodePtr tmp;

        cur->children = xmlNewDocText(doc, value);
        cur->last = NULL;
        tmp = cur->children;
        while (tmp != NULL) {
            tmp->parent = (xmlNodePtr) cur;
            if (tmp->next == NULL)
                cur->last = tmp;
            tmp = tmp->next;
        }
    }

    /*
     * Add it at the end to preserve parsing order ...
     */
    if (node != NULL) {
        if (node->properties == NULL) {
            node->properties = cur;
        } else {
            xmlAttrPtr prev = node->properties;

            while (prev->next != NULL)
                prev = prev->next;
            prev->next = cur;
            cur->prev = prev;
        }
    }

    if ((value != NULL) && (node != NULL) &&
        (xmlIsID(node->doc, node, cur) == 1))
        xmlAddID(NULL, node->doc, value, cur);

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
        xmlRegisterNodeDefaultValue((xmlNodePtr) cur);
    return (cur);
}